

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

LiteralNull * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1)

{
  size_t *psVar1;
  AST *this_00;
  _List_node_base *p_Var2;
  
  this_00 = (AST *)operator_new(0x80);
  AST::AST(this_00,args,AST_LITERAL_NULL,args_1);
  this_00->_vptr_AST = (_func_int **)&PTR__AST_00237078;
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->allocated).
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return (LiteralNull *)this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }